

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

bool CorUnix::PALCS_FullyInitialize(PAL_CRITICAL_SECTION *pPalCriticalSection)

{
  PalCsInitState PVar1;
  LONG LVar2;
  uint uVar3;
  PalCsInitState *Destination;
  bool local_19;
  int iRet;
  bool fRet;
  LONG lNewVal;
  LONG lVal;
  PAL_CRITICAL_SECTION *pPalCriticalSection_local;
  
  local_19 = true;
  PVar1 = ::Volatile::operator_cast_to_PalCsInitState
                    ((Volatile *)&pPalCriticalSection->cisInitState);
  if (PVar1 != PalCsFullyInitialized) {
    if (PVar1 == PalCsUserInitialized) {
      Destination = Volatile<PalCsInitState>::operator&(&pPalCriticalSection->cisInitState);
      LVar2 = InterlockedCompareExchange((LONG *)Destination,2,1);
      if (LVar2 == 1) {
        uVar3 = pthread_mutex_init((pthread_mutex_t *)&pPalCriticalSection->csndNativeData,
                                   (pthread_mutexattr_t *)0x0);
        if (uVar3 == 0) {
          uVar3 = pthread_cond_init((pthread_cond_t *)
                                    &(pPalCriticalSection->csndNativeData).condition,
                                    (pthread_condattr_t *)0x0);
          if (uVar3 == 0) {
            (pPalCriticalSection->csndNativeData).iPredicate = 0;
            Volatile<PalCsInitState>::operator=
                      (&pPalCriticalSection->cisInitState,PalCsFullyInitialized);
          }
          else {
            fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                    ,0x454);
            fprintf(_stderr,"Failed initializing condition in CS @ %p [err=%d]\n",
                    pPalCriticalSection,(ulong)uVar3);
            pthread_mutex_destroy((pthread_mutex_t *)&pPalCriticalSection->csndNativeData);
            Volatile<PalCsInitState>::operator=
                      (&pPalCriticalSection->cisInitState,PalCsUserInitialized);
            local_19 = false;
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
                  ,0x449);
          fprintf(_stderr,"Failed initializing mutex in CS @ %p [err=%d]\n",pPalCriticalSection,
                  (ulong)uVar3);
          Volatile<PalCsInitState>::operator=
                    (&pPalCriticalSection->cisInitState,PalCsUserInitialized);
          local_19 = false;
        }
      }
      else if (LVar2 != 3) {
        sched_yield();
        local_19 = false;
      }
    }
    else if (PVar1 == PalCsFullyInitializing) {
      sched_yield();
      local_19 = false;
    }
    else {
      fprintf(_stderr,"] %s %s:%d","PALCS_FullyInitialize",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
              ,0x46a);
      fprintf(_stderr,"CS %p is not initialized",pPalCriticalSection);
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool PALCS_FullyInitialize(PAL_CRITICAL_SECTION * pPalCriticalSection)
    {
        LONG lVal, lNewVal;
        bool fRet = true;

        lVal = pPalCriticalSection->cisInitState;
        if (PalCsFullyInitialized == lVal)
        {
            goto PCDI_exit;
        }
        if (PalCsUserInitialized == lVal)
        {
            int iRet;
            lNewVal = (LONG)PalCsFullyInitializing;
            lNewVal = InterlockedCompareExchange(
                (LONG *)&pPalCriticalSection->cisInitState, lNewVal, lVal);
            if (lNewVal != lVal)
            {
                if (PalCsFullyInitialized == lNewVal)
                {
                    // Another thread did initialize this CS: we can
                    // safely return 'true'
                    goto PCDI_exit;
                }

                // Another thread is still initializing this CS: yield and
                // spin by returning 'false'
                sched_yield();
                fRet = false;
                goto PCDI_exit;
            }

            //
            // Actual native initialization
            //
            // Mutex
            iRet = pthread_mutex_init(&pPalCriticalSection->csndNativeData.mutex, NULL);
            if (0 != iRet)
            {
                ASSERT("Failed initializing mutex in CS @ %p [err=%d]\n",
                        pPalCriticalSection, iRet);
                pPalCriticalSection->cisInitState = PalCsUserInitialized;
                fRet = false;
                goto PCDI_exit;
            }
#ifndef MUTEX_BASED_CSS
            // Condition
            iRet = pthread_cond_init(&pPalCriticalSection->csndNativeData.condition, NULL);
            if (0 != iRet)
            {
                ASSERT("Failed initializing condition in CS @ %p [err=%d]\n",
                       pPalCriticalSection, iRet);
                pthread_mutex_destroy(&pPalCriticalSection->csndNativeData.mutex);
                pPalCriticalSection->cisInitState = PalCsUserInitialized;
                fRet = false;
                goto PCDI_exit;
            }
            // Predicate
            pPalCriticalSection->csndNativeData.iPredicate = 0;
#endif

            pPalCriticalSection->cisInitState = PalCsFullyInitialized;
        }
        else if (PalCsFullyInitializing == lVal)
        {
            // Another thread is still initializing this CS: yield and
            // spin by returning 'false'
            sched_yield();
            fRet = false;
            goto PCDI_exit;
        }
        else
        {
            ASSERT("CS %p is not initialized", pPalCriticalSection);
            fRet = false;
            goto PCDI_exit;
        }

    PCDI_exit:
        return fRet;
    }